

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O0

int __thiscall
ring_buffer_base<cubeb_log_message>::enqueue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  bool bVar1;
  int *piVar2;
  long in_RSI;
  ring_buffer_base<cubeb_log_message> *in_RDI;
  int second_part;
  int first_part;
  int to_write;
  int wr_idx;
  int rd_idx;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ring_buffer_base<cubeb_log_message> *in_stack_ffffffffffffff40;
  atomic<int> *paVar3;
  cubeb_log_message *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  __int_type_conflict1 local_6c;
  __int_type_conflict1 local_68;
  int local_64;
  long local_60;
  int local_4c;
  int local_40;
  int local_3c;
  atomic<int> *local_38;
  __int_type_conflict1 local_2c;
  memory_order local_28;
  int local_24;
  atomic<int> *local_20;
  __int_type_conflict1 local_14;
  memory_order local_10;
  int local_c;
  
  local_c = 0;
  local_60 = in_RSI;
  local_10 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_c - 1U < 2) {
    local_14 = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  else if (local_c == 5) {
    local_14 = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  else {
    local_14 = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  local_68 = local_14;
  paVar3 = &in_RDI->write_index_;
  local_24 = 0;
  local_20 = paVar3;
  local_28 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_24 - 1U < 2) {
    local_2c = (paVar3->super___atomic_base<int>)._M_i;
  }
  else if (local_24 == 5) {
    local_2c = (paVar3->super___atomic_base<int>)._M_i;
  }
  else {
    local_2c = (paVar3->super___atomic_base<int>)._M_i;
  }
  local_6c = local_2c;
  bVar1 = full_internal(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                        in_stack_ffffffffffffff38);
  if (bVar1) {
    local_4c = 0;
  }
  else {
    local_74 = available_write_internal
                         ((ring_buffer_base<cubeb_log_message> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                          (int)in_stack_ffffffffffffff48);
    piVar2 = std::min<int>(&local_74,&local_64);
    local_70 = *piVar2;
    local_7c = storage_capacity(in_RDI);
    local_7c = local_7c - local_6c;
    piVar2 = std::min<int>(&local_7c,&local_70);
    local_78 = *piVar2;
    if (local_60 == 0) {
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x108f6b);
      ConstructDefault<cubeb_log_message>
                ((cubeb_log_message *)in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x108f92);
      ConstructDefault<cubeb_log_message>
                ((cubeb_log_message *)in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    else {
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x108f11);
      Copy<cubeb_log_message>
                ((cubeb_log_message *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x108f3d);
      Copy<cubeb_log_message>
                ((cubeb_log_message *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
    }
    paVar3 = &in_RDI->write_index_;
    local_3c = increment_index((ring_buffer_base<cubeb_log_message> *)paVar3,
                               in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    local_40 = 3;
    local_38 = paVar3;
    std::operator&(memory_order_release,__memory_order_mask);
    if (local_40 == 3) {
      (paVar3->super___atomic_base<int>)._M_i = local_3c;
    }
    else if (local_40 == 5) {
      LOCK();
      (paVar3->super___atomic_base<int>)._M_i = local_3c;
      UNLOCK();
    }
    else {
      (paVar3->super___atomic_base<int>)._M_i = local_3c;
    }
    local_4c = local_70;
  }
  return local_4c;
}

Assistant:

int enqueue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(producer_id);
#endif

    int rd_idx = read_index_.load(std::memory_order_relaxed);
    int wr_idx = write_index_.load(std::memory_order_relaxed);

    if (full_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_write =
      std::min(available_write_internal(rd_idx, wr_idx), count);

    /* First part, from the write index to the end of the array. */
    int first_part = std::min(storage_capacity() - wr_idx,
                                          to_write);
    /* Second part, from the beginning of the array */
    int second_part = to_write - first_part;

    if (elements) {
      Copy(data_.get() + wr_idx, elements, first_part);
      Copy(data_.get(), elements + first_part, second_part);
    } else {
      ConstructDefault(data_.get() + wr_idx, first_part);
      ConstructDefault(data_.get(), second_part);
    }

    write_index_.store(increment_index(wr_idx, to_write), std::memory_order_release);

    return to_write;
  }